

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::ApiCase::ApiCase(ApiCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  Library *egl;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  egl = EglTestContext::getLibrary(eglTestCtx);
  eglu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,egl,eglTestCtx->m_testCtx->m_log)
  ;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e10a50;
  this->m_display = (EGLDisplay)0x0;
  (this->m_supportedClientAPIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_supportedClientAPIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_supportedClientAPIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ApiCase::ApiCase (EglTestContext& eglTestCtx, const char* name, const char* description)
	: TestCase		(eglTestCtx, name, description)
	, CallLogWrapper(eglTestCtx.getLibrary(), eglTestCtx.getTestContext().getLog())
	, m_display		(EGL_NO_DISPLAY)
{
}